

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,u32 iLabel)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  u32 uVar4;
  u32 uVar5;
  void *pvVar6;
  uint uVar7;
  u8 *puVar8;
  ulong extraout_RDX;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  u32 uVar14;
  uint uVar15;
  char *zLeft;
  long in_FS_OFFSET;
  bool bVar16;
  JsonParse ix;
  JsonParse v;
  u32 sz;
  uint local_fc;
  JsonParse local_d8;
  undefined1 local_88 [16];
  char *local_78;
  sqlite3 *psStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  u8 *local_48;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  cVar2 = *zPath;
  if (cVar2 != '[') {
    if (cVar2 != '.') {
      uVar4 = 0xfffffffd;
      if (cVar2 == '\0') {
        if ((pParse->eEdit != '\0') &&
           (iVar3 = jsonBlobMakeEditable(pParse,pParse->nIns), iVar3 != 0)) {
          uVar4 = jsonbPayloadSize(pParse,iRoot,&local_3c);
          local_3c = uVar4 + local_3c;
          if (pParse->eEdit != '\x03') {
            if (pParse->eEdit == '\x01') {
              if (iLabel != 0) {
                local_3c = (iRoot - iLabel) + local_3c;
                iRoot = iLabel;
              }
              puVar8 = (u8 *)0x0;
              uVar4 = 0;
            }
            else {
              puVar8 = pParse->aIns;
              uVar4 = pParse->nIns;
            }
            jsonBlobEdit(pParse,iRoot,local_3c,puVar8,uVar4);
          }
        }
        pParse->iLabel = iLabel;
        uVar4 = iRoot;
      }
      goto LAB_001ba939;
    }
    bVar11 = pParse->aBlob[iRoot];
    pcVar1 = zPath + 1;
    if (zPath[1] == '\"') {
      uVar10 = 1;
      do {
        uVar13 = (uint)uVar10;
        cVar2 = pcVar1[uVar10];
        if (cVar2 == '\\') {
          if (pcVar1[uVar13 + 1] != '\0') {
            uVar13 = uVar13 + 1;
          }
        }
        else {
          if (cVar2 == '\0') goto LAB_001ba50f;
          if (cVar2 == '\"') goto LAB_001ba519;
        }
        uVar10 = (ulong)(uVar13 + 1);
      } while( true );
    }
    uVar12 = 0;
    while( true ) {
      cVar2 = pcVar1[uVar12];
      if (((cVar2 == '\0') || (cVar2 == '.')) || (cVar2 == '[')) break;
      uVar12 = (ulong)((int)uVar12 + 1);
    }
    local_fc = 1;
    uVar10 = uVar12;
    zLeft = pcVar1;
    if ((int)uVar12 != 0) goto LAB_001ba53b;
LAB_001ba50f:
    uVar4 = 0xfffffffd;
    goto LAB_001ba909;
  }
  if ((pParse->aBlob[iRoot] & 0xf) == 0xb) {
    uVar5 = jsonbPayloadSize(pParse,iRoot,&local_3c);
    bVar11 = zPath[1];
    uVar10 = (ulong)bVar11;
    if (uVar10 - 0x3a < 0xfffffffffffffff6) {
      uVar14 = 0;
      uVar13 = 1;
    }
    else {
      uVar12 = 1;
      uVar14 = 0;
      do {
        uVar14 = ((int)(char)uVar10 + uVar14 * 10) - 0x30;
        uVar13 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar13;
        bVar11 = zPath[uVar12];
        uVar10 = (ulong)bVar11;
      } while (0xfffffffffffffff5 < uVar10 - 0x3a);
    }
    uVar4 = 0xfffffffd;
    if (uVar13 < 2 || bVar11 != 0x5d) {
      if (zPath[1] != '#') goto LAB_001ba939;
      uVar14 = jsonbArrayCount(pParse,iRoot);
      uVar10 = 2;
      if ((zPath[2] == '-') && (0xfffffffffffffff5 < (ulong)(byte)zPath[3] - 0x3a)) {
        uVar13 = 0;
        uVar10 = 3;
        do {
          uVar13 = ((int)zPath[uVar10] + uVar13 * 10) - 0x30;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (0xfffffffffffffff5 < (ulong)(byte)zPath[uVar10] - 0x3a);
        if (uVar14 < uVar13) goto LAB_001ba90f;
        uVar14 = uVar14 - uVar13;
      }
      uVar4 = 0xfffffffd;
      uVar13 = (uint)uVar10;
      if (zPath[uVar10] != ']') goto LAB_001ba939;
    }
    uVar7 = uVar5 + iRoot;
    uVar15 = local_3c + uVar7;
    for (; uVar7 < uVar15; uVar7 = uVar4 + uVar7 + local_3c) {
      bVar16 = uVar14 == 0;
      uVar14 = uVar14 - 1;
      if (bVar16) {
        uVar4 = jsonLookupStep(pParse,uVar7,zPath + (uVar13 + 1),0);
        if (pParse->delta != 0) {
          jsonAfterEditSizeAdjust(pParse,iRoot);
        }
        goto LAB_001ba939;
      }
      uVar4 = jsonbPayloadSize(pParse,uVar7,&local_3c);
      if (uVar4 == 0) {
        uVar4 = 0xffffffff;
        goto LAB_001ba939;
      }
    }
    uVar4 = 0xffffffff;
    if ((uVar15 < uVar7) || (uVar4 = 0xfffffffe, uVar14 != 0)) goto LAB_001ba939;
    if (2 < pParse->eEdit) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      psStack_70 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uVar4 = jsonCreateEditSubstructure(pParse,(JsonParse *)local_88,zPath + (uVar13 + 1));
      if (uVar4 < 0xfffffffd) {
        iVar3 = jsonBlobMakeEditable(pParse,local_88._8_4_);
        if (iVar3 != 0) {
          jsonBlobEdit(pParse,uVar7,0,(u8 *)local_88._0_8_,local_88._8_4_);
        }
      }
      jsonParseReset((JsonParse *)local_88);
      if (pParse->delta != 0) {
        jsonAfterEditSizeAdjust(pParse,iRoot);
      }
      goto LAB_001ba939;
    }
  }
  goto LAB_001ba90f;
LAB_001ba519:
  uVar12 = (ulong)(uVar13 + 1);
  pvVar6 = memchr(zPath + 2,0x5c,(ulong)(uVar13 - 1));
  local_fc = (uint)(pvVar6 == (void *)0x0);
  uVar10 = (ulong)(uVar13 - 1);
  zLeft = zPath + 2;
LAB_001ba53b:
  if ((bVar11 & 0xf) == 0xc) {
    uVar4 = jsonbPayloadSize(pParse,iRoot,&local_3c);
    uVar13 = uVar4 + iRoot;
    uVar7 = local_3c + uVar13;
    uVar9 = extraout_RDX;
    do {
      uVar4 = (u32)uVar9;
      uVar5 = (u32)uVar10;
      if (uVar7 <= uVar13) {
        if (uVar13 <= uVar7) {
          bVar16 = true;
          if (2 < pParse->eEdit) {
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
            local_68 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            psStack_70 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8.aBlob = (u8 *)0x0;
            local_d8.nBlob = 0;
            local_d8.nBlobAlloc = 0;
            local_d8.zJson = (char *)0x0;
            local_d8.nJson = 0;
            local_d8.nJPRef = 0;
            local_d8.iErr = 0;
            local_d8.iDepth = 0;
            local_d8.nErr = '\0';
            local_d8.oom = '\0';
            local_d8.bJsonIsRCStr = '\0';
            local_d8.hasNonstd = '\0';
            local_d8.bReadOnly = '\0';
            local_d8.eEdit = '\0';
            local_d8.delta = 0;
            local_d8.nIns = 0;
            local_d8.iLabel = 0;
            local_d8.aIns = (u8 *)0x0;
            local_d8.db = pParse->db;
            jsonBlobAppendNode(&local_d8,'\n' - (local_fc == 0),uVar5,(void *)0x0);
            pParse->oom = pParse->oom | local_d8.oom;
            uVar4 = jsonCreateEditSubstructure(pParse,(JsonParse *)local_88,pcVar1 + uVar12);
            if (uVar4 < 0xfffffffd) {
              iVar3 = jsonBlobMakeEditable(pParse,local_d8.nBlob + uVar5 + local_88._8_4_);
              if (iVar3 != 0) {
                jsonBlobEdit(pParse,uVar13,0,(u8 *)0x0,local_d8.nBlob + uVar5 + local_88._8_4_);
                if (pParse->oom == '\0') {
                  uVar14 = local_d8.nBlob;
                  memcpy(pParse->aBlob + uVar13,local_d8.aBlob,local_d8._8_8_ & 0xffffffff);
                  memcpy(pParse->aBlob + (uVar13 + uVar14),zLeft,uVar10);
                  memcpy(pParse->aBlob + (uVar13 + uVar14 + uVar5),(void *)local_88._0_8_,
                         local_88._8_8_ & 0xffffffff);
                  if (pParse->delta != 0) {
                    jsonAfterEditSizeAdjust(pParse,iRoot);
                  }
                }
              }
            }
            jsonParseReset((JsonParse *)local_88);
            jsonParseReset(&local_d8);
            bVar16 = false;
          }
          goto LAB_001ba90b;
        }
        uVar4 = 0xffffffff;
        break;
      }
      puVar8 = pParse->aBlob;
      bVar11 = puVar8[uVar13] & 0xf;
      if ((byte)(bVar11 - 0xb) < 0xfc) {
        bVar16 = false;
        uVar9 = 0xffffffff;
      }
      else {
        uVar4 = jsonbPayloadSize(pParse,uVar13,&local_3c);
        if (uVar4 == 0) {
LAB_001ba67b:
          bVar16 = false;
          uVar9 = 0xffffffff;
        }
        else {
          uVar15 = local_3c + uVar4 + uVar13;
          if (uVar15 < uVar7) {
            iVar3 = jsonLabelCompare(zLeft,uVar5,local_fc,(char *)(puVar8 + (uVar4 + uVar13)),
                                     local_3c,(uint)(bVar11 == 10 || bVar11 == 7));
            bVar11 = pParse->aBlob[uVar15] & 0xf;
            if (iVar3 == 0) {
              uVar13 = uVar15;
              if (bVar11 < 0xd) {
                uVar4 = jsonbPayloadSize(pParse,uVar15,&local_3c);
                if (uVar4 != 0) {
                  uVar13 = uVar4 + uVar15 + local_3c;
                  bVar16 = true;
                  uVar9 = uVar9 & 0xffffffff;
                  goto LAB_001ba689;
                }
                goto LAB_001ba67b;
              }
            }
            else if (bVar11 < 0xd) {
              uVar4 = jsonbPayloadSize(pParse,uVar15,&local_3c);
              if (uVar4 == 0) goto LAB_001ba67b;
              if (uVar4 + uVar15 + local_3c <= uVar7) {
                uVar4 = jsonLookupStep(pParse,uVar15,pcVar1 + uVar12,uVar13);
                if (pParse->delta != 0) {
                  jsonAfterEditSizeAdjust(pParse,iRoot);
                }
                uVar9 = (ulong)uVar4;
                bVar16 = false;
                goto LAB_001ba689;
              }
              goto LAB_001ba66b;
            }
            bVar16 = false;
            uVar9 = 0xffffffff;
          }
          else {
LAB_001ba66b:
            bVar16 = false;
            uVar9 = 0xffffffff;
          }
        }
      }
LAB_001ba689:
      uVar4 = (u32)uVar9;
    } while (bVar16);
  }
  else {
    uVar4 = 0xfffffffe;
  }
LAB_001ba909:
  bVar16 = false;
LAB_001ba90b:
  if (!bVar16) goto LAB_001ba939;
LAB_001ba90f:
  uVar4 = 0xfffffffe;
LAB_001ba939:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

static u32 jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this element of aBlob[] */
  const char *zPath,      /* The path to search */
  u32 iLabel              /* Label if iRoot is a value of in an object */
){
  u32 i, j, k, nKey, sz, n, iEnd, rc;
  const char *zKey;
  u8 x;

  if( zPath[0]==0 ){
    if( pParse->eEdit && jsonBlobMakeEditable(pParse, pParse->nIns) ){
      n = jsonbPayloadSize(pParse, iRoot, &sz);
      sz += n;
      if( pParse->eEdit==JEDIT_DEL ){
        if( iLabel>0 ){
          sz += iRoot - iLabel;
          iRoot = iLabel;
        }
        jsonBlobEdit(pParse, iRoot, sz, 0, 0);
      }else if( pParse->eEdit==JEDIT_INS ){
        /* Already exists, so json_insert() is a no-op */
      }else{
        /* json_set() or json_replace() */
        jsonBlobEdit(pParse, iRoot, sz, pParse->aIns, pParse->nIns);
      }
    }
    pParse->iLabel = iLabel;
    return iRoot;
  }
  if( zPath[0]=='.' ){
    int rawKey = 1;
    x = pParse->aBlob[iRoot];
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){
        if( zPath[i]=='\\' && zPath[i+1]!=0 ) i++;
      }
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
      testcase( nKey==0 );
      rawKey = memchr(zKey, '\\', nKey)==0;
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        return JSON_LOOKUP_PATHERROR;
      }
    }
    if( (x & 0x0f)!=JSONB_OBJECT ) return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    j = iRoot + n;  /* j is the index of a label */
    iEnd = j+sz;
    while( j<iEnd ){
      int rawLabel;
      const char *zLabel;
      x = pParse->aBlob[j] & 0x0f;
      if( x<JSONB_TEXT || x>JSONB_TEXTRAW ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      k = j+n;  /* k is the index of the label text */
      if( k+sz>=iEnd ) return JSON_LOOKUP_ERROR;
      zLabel = (const char*)&pParse->aBlob[k];
      rawLabel = x==JSONB_TEXT || x==JSONB_TEXTRAW;
      if( jsonLabelCompare(zKey, nKey, rawKey, zLabel, sz, rawLabel) ){
        u32 v = k+sz;  /* v is the index of the value */
        if( ((pParse->aBlob[v])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
        n = jsonbPayloadSize(pParse, v, &sz);
        if( n==0 || v+n+sz>iEnd ) return JSON_LOOKUP_ERROR;
        assert( j>0 );
        rc = jsonLookupStep(pParse, v, &zPath[i], j);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      j = k+sz;
      if( ((pParse->aBlob[j])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( pParse->eEdit>=JEDIT_INS ){
      u32 nIns;          /* Total bytes to insert (label+value) */
      JsonParse v;       /* BLOB encoding of the value to be inserted */
      JsonParse ix;      /* Header of the label to be inserted */
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      memset(&ix, 0, sizeof(ix));
      ix.db = pParse->db;
      jsonBlobAppendNode(&ix, rawKey?JSONB_TEXTRAW:JSONB_TEXT5, nKey, 0);
      pParse->oom |= ix.oom;
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, ix.nBlob+nKey+v.nBlob)
      ){
        assert( !pParse->oom );
        nIns = ix.nBlob + nKey + v.nBlob;
        jsonBlobEdit(pParse, j, 0, 0, nIns);
        if( !pParse->oom ){
          assert( pParse->aBlob!=0 ); /* Because pParse->oom!=0 */
          assert( ix.aBlob!=0 );      /* Because pPasre->oom!=0 */
          memcpy(&pParse->aBlob[j], ix.aBlob, ix.nBlob);
          k = j + ix.nBlob;
          memcpy(&pParse->aBlob[k], zKey, nKey);
          k += nKey;
          memcpy(&pParse->aBlob[k], v.aBlob, v.nBlob);
          if( ALWAYS(pParse->delta) ) jsonAfterEditSizeAdjust(pParse, iRoot);
        }
      }
      jsonParseReset(&v);
      jsonParseReset(&ix);
      return rc;
    }
  }else if( zPath[0]=='[' ){
    x = pParse->aBlob[iRoot] & 0x0f;
    if( x!=JSONB_ARRAY )  return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    k = 0;
    i = 1;
    while( sqlite3Isdigit(zPath[i]) ){
      k = k*10 + zPath[i] - '0';
      i++;
    }
    if( i<2 || zPath[i]!=']' ){
      if( zPath[1]=='#' ){
        k = jsonbArrayCount(pParse, iRoot);
        i = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int nn = 0;
          i = 3;
          do{
            nn = nn*10 + zPath[i] - '0';
            i++;
          }while( sqlite3Isdigit(zPath[i]) );
          if( nn>k ) return JSON_LOOKUP_NOTFOUND;
          k -= nn;
        }
        if( zPath[i]!=']' ){
          return JSON_LOOKUP_PATHERROR;
        }
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
    }
    j = iRoot+n;
    iEnd = j+sz;
    while( j<iEnd ){
      if( k==0 ){
        rc = jsonLookupStep(pParse, j, &zPath[i+1], 0);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      k--;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( k>0 ) return JSON_LOOKUP_NOTFOUND;
    if( pParse->eEdit>=JEDIT_INS ){
      JsonParse v;
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i+1]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, v.nBlob)
      ){
        assert( !pParse->oom );
        jsonBlobEdit(pParse, j, 0, v.aBlob, v.nBlob);
      }
      jsonParseReset(&v);
      if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
      return rc;
    }
  }else{
    return JSON_LOOKUP_PATHERROR;
  }
  return JSON_LOOKUP_NOTFOUND;
}